

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool __thiscall
crnlib::etc1_optimizer::evaluate_solution
          (etc1_optimizer *this,etc1_solution_coordinates *coords,potential_solution *trial_solution
          ,potential_solution *pBest_solution)

{
  vector<unsigned_char> *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  params *ppVar4;
  color_quad_u8 *pcVar5;
  uchar *puVar6;
  uint uVar7;
  potential_solution *ppVar8;
  potential_solution *ppVar9;
  uchar uVar10;
  uint s;
  uint uVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  int result;
  uint uVar15;
  int result_2;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uchar uVar21;
  int result_1;
  int iVar22;
  uint uVar23;
  int iVar24;
  undefined4 *puVar25;
  uint uVar26;
  ulong uVar27;
  bool bVar28;
  color_quad_u8 block_colors [4];
  byte local_b8 [16];
  potential_solution *local_a8;
  uint64 *local_a0;
  etc1_optimizer *local_98;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  potential_solution *local_60;
  ulong local_58;
  etc1_solution_coordinates *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  trial_solution->m_valid = false;
  ppVar4 = this->m_pParams;
  if (ppVar4->m_constrain_against_base_color5 == true) {
    iVar20 = (uint)(coords->m_unscaled_color).field_0.field_0.r -
             (uint)(ppVar4->m_base_color5).field_0.field_0.r;
    iVar22 = (uint)(coords->m_unscaled_color).field_0.field_0.g -
             (uint)(ppVar4->m_base_color5).field_0.field_0.g;
    iVar24 = (uint)(coords->m_unscaled_color).field_0.field_0.b -
             (uint)(ppVar4->m_base_color5).field_0.field_0.b;
    iVar18 = iVar22;
    if (iVar20 < iVar22) {
      iVar18 = iVar20;
    }
    if (iVar24 <= iVar18) {
      iVar18 = iVar24;
    }
    if (iVar18 < -4) {
      return false;
    }
    if (iVar22 < iVar20) {
      iVar22 = iVar20;
    }
    if (iVar22 <= iVar24) {
      iVar22 = iVar24;
    }
    if (3 < iVar22) {
      return false;
    }
  }
  bVar13 = (coords->m_unscaled_color).field_0.field_0.r;
  if (coords->m_color4 == true) {
    uVar15 = (uint)bVar13 << 4 | (uint)bVar13;
    uVar23 = (uint)(coords->m_unscaled_color).field_0.field_0.g;
    uVar23 = uVar23 << 4 | uVar23;
    local_90 = (uint)(coords->m_unscaled_color).field_0.field_0.b;
    local_90 = local_90 << 4 | local_90;
  }
  else {
    uVar15 = (uint)bVar13 << 3 | (uint)(bVar13 >> 2);
    bVar13 = (coords->m_unscaled_color).field_0.field_0.g;
    uVar23 = (uint)bVar13 << 3 | (uint)(bVar13 >> 2);
    bVar13 = (coords->m_unscaled_color).field_0.field_0.b;
    local_90 = (uint)bVar13 << 3 | (uint)(bVar13 >> 2);
  }
  local_48 = (ulong)uVar15;
  if (0xfe < uVar15) {
    local_48 = 0xff;
  }
  if (0xfe < uVar23) {
    uVar23 = 0xff;
  }
  local_40 = (ulong)uVar23;
  if (0xfe < local_90) {
    local_90 = 0xff;
  }
  local_58 = (ulong)ppVar4->m_num_src_pixels;
  local_a0 = &trial_solution->m_error;
  trial_solution->m_error = 0xffffffffffffffff;
  puVar25 = &g_etc1_inten_tables;
  lVar12 = 0;
  local_a8 = trial_solution;
  do {
    local_38 = lVar12;
    lVar12 = 0;
    do {
      iVar18 = puVar25[lVar12];
      iVar20 = iVar18 + (int)local_48;
      iVar22 = iVar18 + uVar23;
      if (0xfe < iVar20) {
        iVar20 = 0xff;
      }
      if (iVar20 < 1) {
        iVar20 = 0;
      }
      if (0xfe < iVar22) {
        iVar22 = 0xff;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      local_b8[lVar12 * 4] = (byte)iVar20;
      iVar20 = iVar18 + local_90;
      if (0xfe < (int)(iVar18 + local_90)) {
        iVar20 = 0xff;
      }
      local_b8[lVar12 * 4 + 1] = (byte)iVar22;
      bVar13 = (byte)iVar20;
      if (iVar20 < 1) {
        bVar13 = 0;
      }
      local_b8[lVar12 * 4 + 2] = bVar13;
      local_b8[lVar12 * 4 + 3] = 0;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    if (local_58 == 0) {
      uVar17 = 0;
    }
    else {
      pcVar5 = this->m_pParams->m_pSrc_pixels;
      local_64 = (uint)local_b8[0];
      local_68 = (uint)local_b8[1];
      local_6c = (uint)local_b8[2];
      local_70 = (uint)local_b8[4];
      local_74 = (uint)local_b8[5];
      local_78 = (uint)local_b8[6];
      local_7c = (uint)local_b8[8];
      local_80 = (uint)local_b8[9];
      local_84 = (uint)local_b8[10];
      local_88 = (uint)local_b8[0xc];
      local_8c = (uint)local_b8[0xd];
      uVar17 = 0;
      uVar27 = 1;
      do {
        bVar13 = pcVar5[uVar27 - 1].field_0.field_0.r;
        uVar26 = (uint)bVar13;
        bVar1 = pcVar5[uVar27 - 1].field_0.field_0.g;
        iVar18 = bVar1 - local_68;
        bVar2 = pcVar5[uVar27 - 1].field_0.field_0.b;
        uVar16 = (uint)bVar2;
        uVar14 = (uVar16 - local_6c) * (uVar16 - local_6c) +
                 iVar18 * iVar18 + (uVar26 - local_64) * (uVar26 - local_64);
        iVar18 = bVar13 - local_70;
        iVar20 = bVar1 - local_74;
        iVar22 = bVar2 - local_78;
        uVar11 = iVar22 * iVar22 + iVar20 * iVar20 + iVar18 * iVar18;
        uVar15 = uVar11;
        if (uVar11 >= uVar14) {
          uVar15 = uVar14;
        }
        iVar18 = bVar1 - local_80;
        uVar19 = (uVar16 - local_84) * (uVar16 - local_84) +
                 iVar18 * iVar18 + (uVar26 - local_7c) * (uVar26 - local_7c);
        uVar7 = uVar19;
        if (uVar15 <= uVar19) {
          uVar7 = uVar15;
        }
        uVar21 = uVar11 < uVar14;
        if (uVar15 > uVar19) {
          uVar21 = '\x02';
        }
        iVar18 = bVar1 - local_8c;
        uVar15 = (uVar16 - local_b8[0xe]) * (uVar16 - local_b8[0xe]) +
                 iVar18 * iVar18 + (uVar26 - local_88) * (uVar26 - local_88);
        uVar10 = '\x03';
        if (uVar7 <= uVar15) {
          uVar15 = uVar7;
          uVar10 = uVar21;
        }
        (this->m_temp_selectors).m_p[uVar27 - 1] = uVar10;
        uVar17 = uVar15 + uVar17;
      } while ((uVar17 < *local_a0) && (bVar28 = uVar27 < local_58, uVar27 = uVar27 + 1, bVar28));
    }
    if (uVar17 < *local_a0) {
      local_a8->m_error = uVar17;
      (local_a8->m_coords).m_inten_table = (uint)local_38;
      puVar6 = (local_a8->m_selectors).m_p;
      (local_a8->m_selectors).m_p = (this->m_temp_selectors).m_p;
      (this->m_temp_selectors).m_p = puVar6;
      uVar3 = (local_a8->m_selectors).m_size;
      (local_a8->m_selectors).m_size = (this->m_temp_selectors).m_size;
      (this->m_temp_selectors).m_size = uVar3;
      uVar3 = (local_a8->m_selectors).m_capacity;
      (local_a8->m_selectors).m_capacity = (this->m_temp_selectors).m_capacity;
      (this->m_temp_selectors).m_capacity = uVar3;
      local_a8->m_valid = true;
    }
    puVar25 = puVar25 + 4;
    lVar12 = local_38 + 1;
  } while (local_38 + 1 != 8);
  uVar21 = (coords->m_unscaled_color).field_0.field_0.r;
  (local_a8->m_coords).m_unscaled_color.field_0.field_0.r = uVar21;
  (local_a8->m_coords).m_unscaled_color.field_0.field_0.g =
       (coords->m_unscaled_color).field_0.field_0.g;
  (local_a8->m_coords).m_unscaled_color.field_0.field_0.b =
       (coords->m_unscaled_color).field_0.field_0.b;
  (local_a8->m_coords).m_unscaled_color.field_0.field_0.a =
       (coords->m_unscaled_color).field_0.field_0.a;
  (local_a8->m_coords).m_color4 = this->m_pParams->m_use_color4;
  if ((pBest_solution != (potential_solution *)0x0) && (*local_a0 < pBest_solution->m_error)) {
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.r = uVar21;
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.g =
         (local_a8->m_coords).m_unscaled_color.field_0.field_0.g;
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.b =
         (local_a8->m_coords).m_unscaled_color.field_0.field_0.b;
    (pBest_solution->m_coords).m_unscaled_color.field_0.field_0.a =
         (local_a8->m_coords).m_unscaled_color.field_0.field_0.a;
    (pBest_solution->m_coords).m_inten_table = (local_a8->m_coords).m_inten_table;
    (pBest_solution->m_coords).m_color4 = (local_a8->m_coords).m_color4;
    if (pBest_solution != local_a8) {
      local_98 = this;
      local_60 = pBest_solution;
      local_50 = coords;
      if ((pBest_solution->m_selectors).m_capacity < (local_a8->m_selectors).m_size) {
        this_00 = &pBest_solution->m_selectors;
        if (this_00->m_p != (uchar *)0x0) {
          crnlib_free(this_00->m_p);
          this_00->m_p = (uchar *)0x0;
          (pBest_solution->m_selectors).m_size = 0;
          (pBest_solution->m_selectors).m_capacity = 0;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,(local_a8->m_selectors).m_size,false,1,
                   (object_mover)0x0,false);
      }
      else if ((pBest_solution->m_selectors).m_size != 0) {
        (pBest_solution->m_selectors).m_size = 0;
      }
      ppVar9 = local_60;
      ppVar8 = local_a8;
      memcpy((local_60->m_selectors).m_p,(local_a8->m_selectors).m_p,
             (ulong)(local_a8->m_selectors).m_size);
      (ppVar9->m_selectors).m_size = (ppVar8->m_selectors).m_size;
    }
    pBest_solution->m_valid = *(bool *)(local_a0 + 1);
    pBest_solution->m_error = *local_a0;
    return true;
  }
  return false;
}

Assistant:

bool etc1_optimizer::evaluate_solution(const etc1_solution_coordinates& coords, potential_solution& trial_solution, potential_solution* pBest_solution) {
  trial_solution.m_valid = false;

  if (m_pParams->m_constrain_against_base_color5) {
    const int dr = coords.m_unscaled_color.r - m_pParams->m_base_color5.r;
    const int dg = coords.m_unscaled_color.g - m_pParams->m_base_color5.g;
    const int db = coords.m_unscaled_color.b - m_pParams->m_base_color5.b;

    if ((math::minimum(dr, dg, db) < cETC1ColorDeltaMin) || (math::maximum(dr, dg, db) > cETC1ColorDeltaMax))
      return false;
  }

  const color_quad_u8 base_color(coords.get_scaled_color());

  const uint n = m_pParams->m_num_src_pixels;
  CRNLIB_ASSERT(trial_solution.m_selectors.size() == n);

  trial_solution.m_error = cUINT64_MAX;

  for (uint inten_table = 0; inten_table < cETC1IntenModifierValues; inten_table++) {
    const int* pInten_table = g_etc1_inten_tables[inten_table];

    color_quad_u8 block_colors[4];
    for (uint s = 0; s < 4; s++) {
      const int yd = pInten_table[s];
      block_colors[s].set(base_color.r + yd, base_color.g + yd, base_color.b + yd, 0);
    }

    uint64 total_error = 0;

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    for (uint c = 0; c < n; c++) {
      const color_quad_u8& src_pixel = *pSrc_pixels++;

      uint best_selector_index = 0;
      uint best_error = math::square(src_pixel.r - block_colors[0].r) + math::square(src_pixel.g - block_colors[0].g) + math::square(src_pixel.b - block_colors[0].b);

      uint trial_error = math::square(src_pixel.r - block_colors[1].r) + math::square(src_pixel.g - block_colors[1].g) + math::square(src_pixel.b - block_colors[1].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 1;
      }

      trial_error = math::square(src_pixel.r - block_colors[2].r) + math::square(src_pixel.g - block_colors[2].g) + math::square(src_pixel.b - block_colors[2].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 2;
      }

      trial_error = math::square(src_pixel.r - block_colors[3].r) + math::square(src_pixel.g - block_colors[3].g) + math::square(src_pixel.b - block_colors[3].b);
      if (trial_error < best_error) {
        best_error = trial_error;
        best_selector_index = 3;
      }

      m_temp_selectors[c] = static_cast<uint8>(best_selector_index);

      total_error += best_error;
      if (total_error >= trial_solution.m_error)
        break;
    }

    if (total_error < trial_solution.m_error) {
      trial_solution.m_error = total_error;
      trial_solution.m_coords.m_inten_table = inten_table;
      trial_solution.m_selectors.swap(m_temp_selectors);
      trial_solution.m_valid = true;
    }
  }
  trial_solution.m_coords.m_unscaled_color = coords.m_unscaled_color;
  trial_solution.m_coords.m_color4 = m_pParams->m_use_color4;

  bool success = false;
  if (pBest_solution) {
    if (trial_solution.m_error < pBest_solution->m_error) {
      *pBest_solution = trial_solution;
      success = true;
    }
  }

  return success;
}